

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cpp
# Opt level: O0

void rw::V3d::transformPoints(V3d *out,V3d *in,int32 n,Matrix *m)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  V3d *pVVar15;
  V3d tmp;
  int32 i;
  Matrix *m_local;
  int32 n_local;
  V3d *in_local;
  V3d *out_local;
  
  for (tmp.y = 0.0; (int)tmp.y < n; tmp.y = (float32)((int)tmp.y + 1)) {
    fVar1 = (float)in[(int)tmp.y].x;
    fVar2 = (float)(m->right).y;
    fVar3 = (float)in[(int)tmp.y].y;
    fVar4 = (float)(m->up).y;
    fVar5 = (float)in[(int)tmp.y].z;
    fVar6 = (float)(m->at).y;
    fVar7 = (float)(m->pos).y;
    fVar8 = (float)in[(int)tmp.y].x;
    fVar9 = (float)(m->right).z;
    fVar10 = (float)in[(int)tmp.y].y;
    fVar11 = (float)(m->up).z;
    fVar12 = (float)in[(int)tmp.y].z;
    fVar13 = (float)(m->at).z;
    fVar14 = (float)(m->pos).z;
    pVVar15 = out + (int)tmp.y;
    pVVar15->x = (float32)((float)in[(int)tmp.y].z * (float)(m->at).x +
                           (float)in[(int)tmp.y].x * (float)(m->right).x +
                           (float)in[(int)tmp.y].y * (float)(m->up).x + (float)(m->pos).x);
    pVVar15->y = (float32)(fVar5 * fVar6 + fVar1 * fVar2 + fVar3 * fVar4 + fVar7);
    pVVar15->z = (float32)(fVar12 * fVar13 + fVar8 * fVar9 + fVar10 * fVar11 + fVar14);
  }
  return;
}

Assistant:

void
V3d::transformPoints(V3d *out, const V3d *in, int32 n, const Matrix *m)
{
	int32 i;
	V3d tmp;
	for(i = 0; i < n; i++){
		tmp.x = in[i].x*m->right.x + in[i].y*m->up.x + in[i].z*m->at.x + m->pos.x;
		tmp.y = in[i].x*m->right.y + in[i].y*m->up.y + in[i].z*m->at.y + m->pos.y;
		tmp.z = in[i].x*m->right.z + in[i].y*m->up.z + in[i].z*m->at.z + m->pos.z;
		out[i] = tmp;
	}
}